

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O0

void printRegbitsRange(char *buffer,uint32_t data,char *prefix)

{
  uint uVar1;
  size_t sVar2;
  undefined8 in_RDX;
  uint in_ESI;
  char *in_RDI;
  bool bVar3;
  int i;
  uint run_length;
  uint first;
  uint local_24;
  int local_20;
  
  for (local_24 = 0; uVar1 = local_24, (int)local_24 < 8; local_24 = local_24 + 1) {
    if ((in_ESI & 1 << ((byte)local_24 & 0x1f)) != 0) {
      local_20 = 0;
      while( true ) {
        bVar3 = false;
        if ((int)local_24 < 7) {
          bVar3 = (in_ESI & 1 << ((char)local_24 + 1U & 0x1f)) != 0;
        }
        if (!bVar3) break;
        local_24 = local_24 + 1;
        local_20 = local_20 + 1;
      }
      if (*in_RDI != '\0') {
        strcat(in_RDI,"/");
      }
      sVar2 = strlen(in_RDI);
      sprintf(in_RDI + sVar2,"%s%d",in_RDX,(ulong)uVar1);
      if (local_20 != 0) {
        sVar2 = strlen(in_RDI);
        sprintf(in_RDI + sVar2,"-%s%d",in_RDX,(ulong)(uVar1 + local_20));
      }
    }
  }
  return;
}

Assistant:

static void printRegbitsRange(char* buffer, uint32_t data, const char* prefix)
{
	unsigned int first = 0;
	unsigned int run_length = 0;
	int i;

	for (i = 0; i < 8; ++i) {
		if (data & (1 << i)) {
			first = i;
			run_length = 0;

			while (i < 7 && (data & (1 << (i + 1)))) {
				i++;
				run_length++;
			}

			if (buffer[0] != 0)
				strcat(buffer, "/");

			sprintf(buffer + strlen(buffer), "%s%d", prefix, first);
			if (run_length > 0)
				sprintf(buffer + strlen(buffer), "-%s%d", prefix, first + run_length);
		}
	}
}